

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

StringRef llvm::sys::path::filename(StringRef path,Style style)

{
  Style in_R8D;
  StringRef Path;
  reverse_iterator local_40;
  
  Path.Length._0_4_ = style;
  Path.Data = (char *)path.Length;
  Path.Length._4_4_ = 0;
  rbegin(&local_40,(path *)path.Data,Path,in_R8D);
  return local_40.Component;
}

Assistant:

StringRef filename(StringRef path, Style style) { return *rbegin(path, style); }